

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

size_t revealSeedsSize(uint numNodes,uint16_t *hideList,size_t hideListSize,
                      picnic_instance_t *params)

{
  _Bool _Var1;
  uint *__ptr;
  size_t sVar2;
  size_t numNodesRevealed;
  tree_t tree;
  
  _Var1 = createTree(&tree,numNodes,0);
  if (_Var1) {
    numNodesRevealed = 0;
    __ptr = getRevealedNodes(&tree,hideList,hideListSize,&numNodesRevealed);
    clearTree(&tree);
    free(__ptr);
    sVar2 = params->seed_size * numNodesRevealed;
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

size_t revealSeedsSize(unsigned int numNodes, uint16_t* hideList, size_t hideListSize,
                       const picnic_instance_t* params) {
  tree_t tree;
  if (!createTree(&tree, numNodes, 0)) {
    return SIZE_MAX;
  }

  size_t numNodesRevealed = 0;
  unsigned int* revealed  = getRevealedNodes(&tree, hideList, hideListSize, &numNodesRevealed);
  clearTree(&tree);
  free(revealed);
  return numNodesRevealed * params->seed_size;
}